

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
          (detail *this,basic_appender<char> out,write_int_arg<unsigned_long> arg,
          format_specs *specs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  basic_appender<char> bVar4;
  char *begin;
  uint uVar5;
  format_specs *specs_00;
  char *pcVar6;
  long lVar7;
  buffer<char> *buf;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  char buffer [64];
  anon_class_24_4_0fb5e8cf local_80;
  char local_68 [63];
  byte local_29;
  
  specs_00 = arg._8_8_;
  begin = &stack0xffffffffffffffd8;
  uVar3 = (uint)arg.abs_value;
  uVar5 = (specs_00->super_basic_specs).data_;
  switch(uVar5 & 7) {
  case 4:
    pcVar6 = "0123456789ABCDEF";
    begin = &stack0xffffffffffffffd8;
    if ((uVar5 >> 0xc & 1) == 0) {
      pcVar6 = "0123456789abcdef";
      begin = &stack0xffffffffffffffd8;
    }
    do {
      begin[-1] = pcVar6[(uint)out.container & 0xf];
      begin = begin + -1;
      bVar10 = (buffer<char> *)0xf < out.container;
      out.container = out.container >> 4;
    } while (bVar10);
    if ((uVar5 >> 0xd & 1) == 0) goto LAB_00143eaf;
    uVar5 = (uint)((uVar5 >> 0xc & 1) == 0) << 0xd | 0x5830;
    break;
  case 5:
    lVar7 = 0;
    bVar4.container = out.container;
    do {
      begin[-1] = (byte)bVar4.container & 7 | 0x30;
      begin = begin + -1;
      lVar7 = lVar7 + 1;
      bVar10 = (buffer<char> *)0x7 < bVar4.container;
      bVar4.container = bVar4.container >> 3;
    } while (bVar10);
    if (((uVar5 >> 0xd & 1) != 0) &&
       (out.container != (buffer<char> *)0x0 && specs_00->precision <= lVar7)) {
      uVar5 = 0x3000;
      if (uVar3 == 0) {
        uVar5 = 0x30;
      }
      uVar3 = (uVar5 | uVar3) + 0x1000000;
    }
    goto LAB_00143eaf;
  case 6:
    begin = &stack0xffffffffffffffd8;
    do {
      begin[-1] = (byte)out.container & 1 | 0x30;
      begin = begin + -1;
      bVar10 = (buffer<char> *)0x1 < out.container;
      out.container = out.container >> 1;
    } while (bVar10);
    if ((uVar5 >> 0xd & 1) == 0) goto LAB_00143eaf;
    uVar5 = (uint)((uVar5 >> 0xc & 1) == 0) << 0xd | 0x4230;
    break;
  case 7:
    local_80.prefix._0_2_ = CONCAT11((char)out.container,(uVar5 & 7) == 1);
    bVar4 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      ((basic_appender<char>)this,specs_00,1,1,(anon_class_2_2_bf5026b7 *)&local_80)
    ;
    return (basic_appender<char>)bVar4.container;
  default:
    begin = do_format_decimal<char,unsigned_long>(local_68,(unsigned_long)out.container,0x40);
    goto LAB_00143eaf;
  }
  uVar2 = uVar5 << 8;
  if (uVar3 == 0) {
    uVar2 = uVar5;
  }
  uVar3 = (uVar2 | uVar3) + 0x2000000;
LAB_00143eaf:
  iVar9 = (int)&stack0xffffffffffffffd8 - (int)begin;
  uVar2 = specs_00->width;
  iVar1 = specs_00->precision;
  uVar5 = (uVar3 >> 0x18) + iVar9;
  if (iVar1 == -1 && uVar2 == 0) {
    if (*(ulong *)(this + 0x10) < (ulong)uVar5 + *(long *)(this + 8)) {
      (**(code **)(this + 0x18))(this);
    }
    uVar5 = uVar3 & 0xffffff;
    if ((uVar3 & 0xffffff) != 0) {
      do {
        lVar7 = *(long *)(this + 8);
        uVar8 = lVar7 + 1;
        if (*(ulong *)(this + 0x10) < uVar8) {
          (**(code **)(this + 0x18))(this);
          lVar7 = *(long *)(this + 8);
          uVar8 = lVar7 + 1;
        }
        *(ulong *)(this + 8) = uVar8;
        *(char *)(*(long *)this + lVar7) = (char)uVar5;
        bVar10 = 0xff < uVar5;
        uVar5 = uVar5 >> 8;
      } while (bVar10);
    }
    buffer<char>::append<char>((buffer<char> *)this,begin,&stack0xffffffffffffffd8);
  }
  else {
    if (((specs_00->super_basic_specs).data_ & 0x38) == 0x20) {
      local_80.padding = uVar2 - uVar5;
      bVar10 = local_80.padding != 0;
      if (uVar2 < uVar5) {
        local_80.padding = 0;
      }
      if (uVar2 >= uVar5 && bVar10) {
        uVar5 = uVar2;
      }
    }
    else {
      local_80.padding = 0;
      if (iVar1 - iVar9 != 0 && iVar9 <= iVar1) {
        local_80.padding = iVar1 - iVar9;
        uVar5 = iVar1 + (uVar3 >> 0x18);
      }
    }
    local_80.prefix = uVar3;
    local_80.begin = begin;
    local_80.end = &stack0xffffffffffffffd8;
    this = (detail *)
           write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_long>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                     ((basic_appender<char>)this,specs_00,(ulong)uVar5,(ulong)uVar5,&local_80);
  }
  return (basic_appender<char>)(buffer<char> *)this;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}